

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O0

ssize_t __thiscall SID::read(SID *this,int __fd,void *__buf,size_t __nbytes)

{
  uint local_4;
  
  switch(__fd) {
  case 0x19:
    local_4 = Potentiometer::readPOT((Potentiometer *)&this->field_0x4224);
    break;
  case 0x1a:
    local_4 = Potentiometer::readPOT((Potentiometer *)&this->field_0x4225);
    break;
  case 0x1b:
    local_4 = WaveformGenerator::readOSC((WaveformGenerator *)0x163c6a);
    break;
  case 0x1c:
    local_4 = EnvelopeGenerator::readENV((EnvelopeGenerator *)0x163c84);
    break;
  default:
    local_4 = this->bus_value;
  }
  return (ulong)local_4;
}

Assistant:

reg8 SID::read(reg8 offset)
{
  switch (offset) {
  case 0x19:
    return potx.readPOT();
  case 0x1a:
    return poty.readPOT();
  case 0x1b:
    return voice[2].wave.readOSC();
  case 0x1c:
    return voice[2].envelope.readENV();
  default:
    return bus_value;
  }
}